

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverLifetimesTest_ValueAndFeatureSupportDeprecated_Test
::TestBody(FeatureResolverLifetimesTest_ValueAndFeatureSupportDeprecated_Test *this)

{
  VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *matchers_1;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *matcher;
  char *pcVar1;
  AssertionResult gtest_ar_1;
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_388;
  undefined1 local_328 [32];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  ValidationResults results;
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  AssertionResult gtest_ar;
  FeatureSet features;
  _Tuple_impl<0UL,_testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_c8;
  
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )anon_var_dwarf_6e2b76;
  ParseTextOrDie::operator_cast_to_FeatureSet(&features,(ParseTextOrDie *)&gtest_ar);
  FeatureResolver::ValidateFeatureLifetimes
            (&results,EDITION_99998_TEST_ONLY,&features,(Descriptor *)0x0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>::
  operator()(&gtest_ar,(char *)&local_388,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)"results.errors");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_388);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x302,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((long *)local_388.
                super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super__Tuple_impl<2UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super__Head_base<2UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                ._M_head_impl.impl_.substring_._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_388.
                            super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            .
                            super__Tuple_impl<2UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            .
                            super__Head_base<2UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                            ._M_head_impl.impl_.substring_._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::HasSubstr<char[29]>(&local_288,(StringLike<char[29]> *)"pb.VALUE_LIFETIME_DEPRECATED");
  testing::HasSubstr<char[38]>
            (&local_2a8,(StringLike<char[38]> *)"deprecated in edition 99997_TEST_ONLY");
  testing::HasSubstr<char[35]>
            (&local_2c8,(StringLike<char[35]> *)"Custom feature deprecation warning");
  std::
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Tuple_impl(&local_388,&local_288,&local_2a8,&local_2c8);
  testing::HasSubstr<char[39]>
            (&local_2e8,(StringLike<char[39]> *)"pb.TestFeatures.value_lifetime_feature");
  testing::HasSubstr<char[38]>
            (&local_308,(StringLike<char[38]> *)"deprecated in edition 99998_TEST_ONLY");
  testing::HasSubstr<char[35]>
            ((PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_328,(StringLike<char[35]> *)"Custom feature deprecation warning");
  matchers_1 = (VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_328;
  std::
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Tuple_impl(&local_238,&local_2e8,&local_308,
                (PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)matchers_1);
  testing::
  UnorderedElementsAre<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>,testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
            ((UnorderedElementsAreMatcher<std::tuple<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)&local_c8,(testing *)&local_388,
             (VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_238,matchers_1);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>,testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>>>
            ((PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)&gtest_ar,(internal *)&local_c8,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>,testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>>>
  ::operator()(&gtest_ar_1,&gtest_ar.success_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"results.warnings");
  std::
  _Tuple_impl<0UL,_testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&gtest_ar);
  std::
  _Tuple_impl<0UL,_testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Tuple_impl(&local_c8);
  std::
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Tuple_impl(&local_238);
  std::__cxx11::string::~string((string *)local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Tuple_impl(&local_388);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x30a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_388,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_388);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  FeatureResolver::ValidationResults::~ValidationResults(&results);
  FeatureSet::~FeatureSet(&features);
  return;
}

Assistant:

TEST(FeatureResolverLifetimesTest, ValueAndFeatureSupportDeprecated) {
  FeatureSet features = ParseTextOrDie(R"pb(
    [pb.test] { value_lifetime_feature: VALUE_LIFETIME_DEPRECATED }
  )pb");
  auto results = FeatureResolver::ValidateFeatureLifetimes(
      EDITION_99998_TEST_ONLY, features, nullptr);
  EXPECT_THAT(results.errors, IsEmpty());
  EXPECT_THAT(results.warnings,
              UnorderedElementsAre(
                  AllOf(HasSubstr("pb.VALUE_LIFETIME_DEPRECATED"),
                        HasSubstr("deprecated in edition 99997_TEST_ONLY"),
                        HasSubstr("Custom feature deprecation warning")),
                  AllOf(HasSubstr("pb.TestFeatures.value_lifetime_feature"),
                        HasSubstr("deprecated in edition 99998_TEST_ONLY"),
                        HasSubstr("Custom feature deprecation warning"))));
}